

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_options(archive_write_filter *f,char *key,char *value)

{
  int iVar1;
  uint32_t uVar2;
  int *piVar3;
  ulong uVar4;
  char *local_38;
  char *endptr;
  private_data_conflict7 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  endptr = (char *)f->data;
  data = (private_data_conflict7 *)value;
  value_local = key;
  key_local = (char *)f;
  iVar1 = strcmp(key,"compression-level");
  if (iVar1 == 0) {
    if ((((data == (private_data_conflict7 *)0x0) || ((char)data->compression_level < '0')) ||
        ('9' < (char)data->compression_level)) ||
       (*(char *)((long)&data->compression_level + 1) != '\0')) {
      f_local._4_4_ = -0x14;
    }
    else {
      *(int *)endptr = (char)data->compression_level + -0x30;
      if (9 < *(int *)endptr) {
        endptr[0] = '\t';
        endptr[1] = '\0';
        endptr[2] = '\0';
        endptr[3] = '\0';
      }
      f_local._4_4_ = 0;
    }
  }
  else {
    iVar1 = strcmp(value_local,"threads");
    if (iVar1 == 0) {
      if (data == (private_data_conflict7 *)0x0) {
        f_local._4_4_ = -0x14;
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0;
        uVar4 = strtoul((char *)data,&local_38,10);
        *(int *)(endptr + 4) = (int)uVar4;
        piVar3 = __errno_location();
        if ((*piVar3 == 0) && (*local_38 == '\0')) {
          if (*(int *)(endptr + 4) == 0) {
            uVar2 = lzma_cputhreads();
            *(uint32_t *)(endptr + 4) = uVar2;
          }
          f_local._4_4_ = 0;
        }
        else {
          endptr[4] = '\x01';
          endptr[5] = '\0';
          endptr[6] = '\0';
          endptr[7] = '\0';
          f_local._4_4_ = -0x14;
        }
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_xz_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		if (data->compression_level > 9)
			data->compression_level = 9;
#ifdef _AIX
		if (data->compression_level > 6)
			data->compression_level = 6;
#endif
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		char *endptr;

		if (value == NULL)
			return (ARCHIVE_WARN);
		errno = 0;
		data->threads = (int)strtoul(value, &endptr, 10);
		if (errno != 0 || *endptr != '\0') {
			data->threads = 1;
			return (ARCHIVE_WARN);
		}
		if (data->threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			data->threads = lzma_cputhreads();
#else
			data->threads = 1;
#endif
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}